

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-test.cpp
# Opt level: O2

FileInfoWrapper<ASDCP::TimedText::MXFReader,_MyTextDescriptor> * __thiscall
FileInfoWrapper<ASDCP::TimedText::MXFReader,_MyTextDescriptor>::file_info
          (FileInfoWrapper<ASDCP::TimedText::MXFReader,_MyTextDescriptor> *this,
          CommandOptions *Options,char *type_string,IFileReaderFactory *fileReaderFactory,
          FILE *stream)

{
  MXFReader Reader;
  MyTextDescriptor Desc;
  WriterInfo WI;
  allocator<char> local_1f1;
  undefined1 local_1f0 [16];
  TimedTextDescriptor local_1e0;
  WriterInfo local_148;
  
  if (type_string != (char *)0x0) {
    if (stream == (FILE *)0x0) {
      stream = (FILE *)_stdout;
    }
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    if ((Options->verbose_flag != false) || (Options->showheader_flag == true)) {
      ASDCP::TimedText::MXFReader::MXFReader((MXFReader *)local_1f0,fileReaderFactory);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_1f0 + 0x10),Options->filenames[0],&local_1f1);
      ASDCP::TimedText::MXFReader::OpenRead((string *)&local_148);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_148);
      Kumu::Result_t::~Result_t((Result_t *)&local_148);
      std::__cxx11::string::~string((string *)(local_1f0 + 0x10));
      if (*(int *)this < 0) {
        if ((*(int *)this == ASDCP::RESULT_FORMAT) && (Options->showheader_flag == true)) {
          ASDCP::TimedText::MXFReader::DumpHeaderMetadata((_IO_FILE *)local_1f0);
        }
      }
      else {
        fprintf(_stdout,"File essence type is %s.\n",type_string);
        if (Options->showheader_flag == true) {
          ASDCP::TimedText::MXFReader::DumpHeaderMetadata((_IO_FILE *)local_1f0);
        }
        ASDCP::WriterInfo::WriterInfo(&local_148);
        ASDCP::TimedText::MXFReader::FillWriterInfo((WriterInfo *)&stack0xffffffffffffff68);
        Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
        ASDCP::WriterInfoDump(&local_148,(_IO_FILE *)stream);
        ASDCP::TimedText::TimedTextDescriptor::TimedTextDescriptor
                  ((TimedTextDescriptor *)(local_1f0 + 0x10));
        MyTextDescriptor::FillDescriptor
                  ((MyTextDescriptor *)(local_1f0 + 0x10),(MXFReader *)local_1f0);
        ASDCP::TimedText::DescriptorDump
                  ((TimedTextDescriptor *)(local_1f0 + 0x10),(_IO_FILE *)stream);
        if (Options->showindex_flag == true) {
          ASDCP::TimedText::MXFReader::DumpIndex((_IO_FILE *)local_1f0);
        }
        ASDCP::TimedText::TimedTextDescriptor::~TimedTextDescriptor
                  ((TimedTextDescriptor *)(local_1f0 + 0x10));
        ASDCP::WriterInfo::~WriterInfo(&local_148);
      }
      ASDCP::TimedText::MXFReader::~MXFReader((MXFReader *)local_1f0);
    }
    return this;
  }
  __assert_fail("type_string",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/asdcp-test.cpp"
                ,0x6f0,
                "static Result_t FileInfoWrapper<ASDCP::TimedText::MXFReader, MyTextDescriptor>::file_info(CommandOptions &, const char *, const Kumu::IFileReaderFactory &, FILE *) [ReaderT = ASDCP::TimedText::MXFReader, DescriptorT = MyTextDescriptor]"
               );
}

Assistant:

static Result_t
  file_info(CommandOptions& Options, const char* type_string, const Kumu::IFileReaderFactory& fileReaderFactory, FILE* stream = 0)
  {
    assert(type_string);
    if ( stream == 0 )
      stream = stdout;

    Result_t result = RESULT_OK;

    if ( Options.verbose_flag || Options.showheader_flag )
      {
	ReaderT     Reader(fileReaderFactory);
	result = Reader.OpenRead(Options.filenames[0]);

	if ( ASDCP_SUCCESS(result) )
	  {
	    fprintf(stdout, "File essence type is %s.\n", type_string);

	    if ( Options.showheader_flag )
	      Reader.DumpHeaderMetadata(stream);

	    WriterInfo WI;
	    Reader.FillWriterInfo(WI);
	    WriterInfoDump(WI, stream);

	    DescriptorT Desc;
	    Desc.FillDescriptor(Reader);
	    Desc.Dump(stream);

	    if ( Options.showindex_flag )
	      Reader.DumpIndex(stream);
	  }
	else if ( result == RESULT_FORMAT && Options.showheader_flag )
	  {
	    Reader.DumpHeaderMetadata(stream);
	  }
      }

    return result;
  }